

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_material.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::random_internal::ReadSeedMaterialFromOSEntropy
          (random_internal *this,Span<unsigned_int> values)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_type sVar4;
  size_type extraout_RDX;
  size_t __nbytes;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  uint8_t *buffer;
  random_internal *prVar8;
  
  sVar4 = values.len_;
  if (this == (random_internal *)0x0) {
    __assert_fail("values.data() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/random/internal/seed_material.cc"
                  ,0xce,
                  "bool absl::random_internal::ReadSeedMaterialFromOSEntropy(absl::Span<uint32_t>)")
    ;
  }
  bVar5 = true;
  if (values.ptr_ != (pointer)0x0) {
    __nbytes = (long)values.ptr_ << 2;
    sVar7 = __nbytes;
    prVar8 = this;
    do {
      if (sVar7 == 0) {
        return true;
      }
      uVar6 = sVar7;
      if (0xff < sVar7) {
        uVar6 = 0x100;
      }
      iVar1 = getentropy(prVar8,uVar6,sVar4);
      if (iVar1 < 0) {
        uVar6 = 0;
      }
      sVar7 = sVar7 - uVar6;
      prVar8 = prVar8 + uVar6;
      sVar4 = extraout_RDX;
    } while (-1 < iVar1);
    bVar5 = false;
    iVar1 = open("/dev/urandom",0);
    if (iVar1 != -1) {
      if (__nbytes == 0) {
        bVar5 = true;
      }
      else {
        do {
          sVar2 = read(iVar1,this,__nbytes);
          if (sVar2 < 1) {
            piVar3 = __errno_location();
            bVar5 = *piVar3 == 4 && sVar2 == -1;
          }
          else {
            this = this + sVar2;
            __nbytes = __nbytes - sVar2;
            bVar5 = true;
          }
        } while ((bVar5 != false) && (__nbytes != 0));
      }
      close(iVar1);
    }
  }
  return bVar5;
}

Assistant:

bool ReadSeedMaterialFromOSEntropy(absl::Span<uint32_t> values) {
  assert(values.data() != nullptr);
  if (values.data() == nullptr) {
    return false;
  }
  if (values.empty()) {
    return true;
  }
  return ReadSeedMaterialFromOSEntropyImpl(values);
}